

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O2

void amrex::UtilCreateCleanDirectory(string *path,bool callbarrier)

{
  ostringstream *poVar1;
  bool bVar2;
  ostream *os_;
  string newoldname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  Print local_1a0;
  
  if (*(int *)(DAT_007dd980 + -0x3c) == *(int *)(DAT_007dd980 + -0x30)) {
    bVar2 = FileSystem::Exists(path);
    if (bVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0
                     ,path,".old.");
      UniqueString_abi_cxx11_();
      std::operator+(&local_1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0
                     ,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1a0);
      if (1 < system::verbose) {
        os_ = OutStream();
        Print::Print(&local_1a0,os_);
        poVar1 = &local_1a0.ss;
        std::operator<<((ostream *)poVar1,"amrex::UtilCreateCleanDirectory():  ");
        std::operator<<((ostream *)poVar1,(string *)path);
        std::operator<<((ostream *)poVar1," exists.  Renaming to:  ");
        std::operator<<((ostream *)poVar1,(string *)&local_1e0);
        std::endl<char,std::char_traits<char>>((ostream *)poVar1);
        Print::~Print(&local_1a0);
      }
      rename((path->_M_dataplus)._M_p,local_1e0._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    bVar2 = FileSystem::CreateDirectories(path,0x1ed,false);
    if (!bVar2) {
      CreateDirectoryFailed(path);
    }
  }
  if (callbarrier) {
    std::__cxx11::string::string
              ((string *)&local_1a0,"amrex::UtilCreateCleanDirectory",(allocator *)&local_1e0);
    ParallelDescriptor::Barrier((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  return;
}

Assistant:

void
amrex::UtilCreateCleanDirectory (const std::string &path, bool callbarrier)
{
  if(ParallelContext::IOProcessorSub()) {
    if(amrex::FileExists(path)) {
      std::string newoldname(path + ".old." + amrex::UniqueString());
      if (amrex::system::verbose > 1) {
          amrex::Print() << "amrex::UtilCreateCleanDirectory():  " << path
                         << " exists.  Renaming to:  " << newoldname << std::endl;
      }
      std::rename(path.c_str(), newoldname.c_str());
    }
    if( ! amrex::UtilCreateDirectory(path, 0755)) {
      amrex::CreateDirectoryFailed(path);
    }
  }
  if(callbarrier) {
    // Force other processors to wait until directory is built.
    ParallelDescriptor::Barrier("amrex::UtilCreateCleanDirectory");
  }
}